

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

bool __thiscall VertexAttrib64Bit::LimitTest::verifyResult(LimitTest *this,bool use_instancing)

{
  GLenum GVar1;
  TestError *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_348;
  MessageBuilder local_1c8;
  uint local_44;
  uint local_40;
  GLuint vertex_offset;
  GLuint vertex;
  GLuint instance_offset;
  GLuint instance;
  byte local_25;
  uint local_24;
  bool result;
  void *pvStack_20;
  GLuint n_instances;
  _varyingType *buffer_data;
  LimitTest *pLStack_10;
  bool use_instancing_local;
  LimitTest *this_local;
  
  buffer_data._7_1_ = use_instancing;
  pLStack_10 = this;
  pvStack_20 = (*(this->super_Base).gl.mapBuffer)(0x8c8e,35000);
  local_24 = 1;
  if ((buffer_data._7_1_ & 1) == 1) {
    local_24 = 0x10;
  }
  local_25 = 1;
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb8e);
  if (pvStack_20 == (void *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to map GL_TRANSFORM_FEEDBACK_BUFFER buffer",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
               ,0xb92);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  vertex = 0;
  do {
    if (local_24 <= vertex) {
LAB_010d91a8:
      (*(this->super_Base).gl.unmapBuffer)(0x8c8e);
      GVar1 = (*(this->super_Base).gl.getError)();
      glu::checkError(GVar1,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                      ,0xbb6);
      return (bool)(local_25 & 1);
    }
    vertex_offset = vertex * 0x400;
    for (local_40 = 0; local_40 < 0x400; local_40 = local_40 + 1) {
      local_44 = local_40;
      if (*(int *)((long)pvStack_20 + (ulong)(local_40 + vertex_offset) * 4) != 1) {
        if ((buffer_data._7_1_ & 1) == 1) {
          tcu::TestLog::operator<<
                    (&local_1c8,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar2 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [20])"Failure. Instance: ");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&vertex);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [10])0x2a53338);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_40);
          tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1c8);
        }
        else {
          tcu::TestLog::operator<<
                    (&local_348,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar2 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [18])"Failure. Vertex: ");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_40);
          tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_348);
        }
        local_25 = 0;
        goto LAB_010d91a8;
      }
    }
    vertex = vertex + 1;
  } while( true );
}

Assistant:

bool LimitTest::verifyResult(bool use_instancing) const
{
	_varyingType* buffer_data = (_varyingType*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	const GLuint  n_instances = (true == use_instancing) ? m_n_instances : 1;
	bool		  result	  = true;

	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	if (0 == buffer_data)
	{
		TCU_FAIL("Failed to map GL_TRANSFORM_FEEDBACK_BUFFER buffer");
	}

	/* For each instance */
	for (GLuint instance = 0; instance < n_instances; ++instance)
	{
		const GLuint instance_offset = instance * m_n_vertices * m_n_varyings;

		/* For each vertex */
		for (GLuint vertex = 0; vertex < m_n_vertices; ++vertex)
		{
			const GLuint vertex_offset = vertex * m_n_varyings;

			if (1 != buffer_data[vertex_offset + instance_offset])
			{
				if (true == use_instancing)
				{
					m_log << tcu::TestLog::Message << "Failure. Instance: " << instance << " Vertex: " << vertex
						  << tcu::TestLog::EndMessage;
				}
				else
				{
					m_log << tcu::TestLog::Message << "Failure. Vertex: " << vertex << tcu::TestLog::EndMessage;
				}

				/* Save failure and break loop */
				result = false;

				/* Sorry about that, but this is nested loop */
				goto end;
			}
		}
	}

end:
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	return result;
}